

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O0

bool __thiscall
CNetTokenManager::CheckToken
          (CNetTokenManager *this,NETADDR *pAddr,TOKEN Token,TOKEN ResponseToken,
          bool *BroadcastResponse)

{
  TOKEN TVar1;
  TOKEN in_EDX;
  NETADDR *in_RDI;
  undefined1 *in_R8;
  TOKEN CurrentToken;
  bool local_1;
  
  TVar1 = GenerateToken(in_RDI,(int64)in_R8);
  if (TVar1 == in_EDX) {
    local_1 = true;
  }
  else {
    TVar1 = GenerateToken(in_RDI,(int64)in_R8);
    if (TVar1 == in_EDX) {
      local_1 = true;
    }
    else if (in_EDX == in_RDI[1].type) {
      *in_R8 = 1;
      local_1 = true;
    }
    else if (in_EDX == *(TOKEN *)in_RDI[1].ip) {
      *in_R8 = 1;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CNetTokenManager::CheckToken(const NETADDR *pAddr, TOKEN Token, TOKEN ResponseToken, bool *BroadcastResponse)
{
	TOKEN CurrentToken = GenerateToken(pAddr, m_Seed);
	if(CurrentToken == Token)
		return true;

	if(GenerateToken(pAddr, m_PrevSeed) == Token)
	{
		// no need to notify the peer, just a one time thing
		return true;
	}
	else if(Token == m_GlobalToken)
	{
		*BroadcastResponse = true;
		return true;
	}
	else if(Token == m_PrevGlobalToken)
	{
		// no need to notify the peer, just a broadcast token response
		*BroadcastResponse = true;
		return true;
	}

	return false;
}